

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmatrix.h
# Opt level: O0

DMatrix<double> * __thiscall
gmath::DMatrix<double>::operator=(DMatrix<double> *this,DMatrix<double> *a)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  double *pdVar3;
  int *in_RSI;
  DMatrix<double> *in_RDI;
  int i;
  int local_14;
  
  if ((in_RDI->v != (double *)0x0) && (in_RDI->v != (double *)0x0)) {
    operator_delete__(in_RDI->v);
  }
  in_RDI->nrows = *in_RSI;
  in_RDI->ncols = in_RSI[1];
  in_RDI->n = in_RDI->nrows * in_RDI->ncols;
  in_RDI->v = (double *)0x0;
  if (0 < in_RDI->n) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)in_RDI->n;
    uVar2 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar2 = 0xffffffffffffffff;
    }
    pdVar3 = (double *)operator_new__(uVar2);
    in_RDI->v = pdVar3;
    for (local_14 = 0; local_14 < in_RDI->n; local_14 = local_14 + 1) {
      in_RDI->v[local_14] = *(double *)(*(long *)(in_RSI + 4) + (long)local_14 * 8);
    }
  }
  return in_RDI;
}

Assistant:

DMatrix<T> &operator=(const DMatrix<T> &a)
    {
      if (v != 0)
      {
        delete [] v;
      }

      nrows=a.nrows;
      ncols=a.ncols;
      n=nrows*ncols;

      v=0;

      if (n > 0)
      {
        v=new T[n];

        for (int i=0; i<n; i++)
        {
          v[i]=a.v[i];
        }
      }

      return *this;
    }